

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

string * lf_random_string_abi_cxx11_(void)

{
  uint uVar1;
  string *in_RDI;
  string str;
  random_device rd;
  mt19937 generator;
  
  std::__cxx11::string::string
            ((string *)&str,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz",
             (allocator *)&rd);
  std::random_device::random_device(&rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&generator,(ulong)uVar1);
  std::
  shuffle<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )str._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(str._M_dataplus._M_p + str._M_string_length),&generator);
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)&str);
  std::random_device::~random_device(&rd);
  std::__cxx11::string::~string((string *)&str);
  return in_RDI;
}

Assistant:

std::string lf_random_string()
{
    std::string str("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz");

    std::random_device rd;
    std::mt19937 generator(rd());

    std::shuffle(str.begin(), str.end(), generator);

    return str.substr(0, 8);
}